

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::TimeZoneNames::getDisplayName
          (TimeZoneNames *this,UnicodeString *tzID,UTimeZoneNameType type,UDate date,
          UnicodeString *name)

{
  UBool UVar1;
  undefined1 local_b8 [8];
  UnicodeString mzID;
  UChar mzIDBuf [32];
  UnicodeString *name_local;
  UDate date_local;
  UTimeZoneNameType type_local;
  UnicodeString *tzID_local;
  TimeZoneNames *this_local;
  
  (*(this->super_UObject)._vptr_UObject[10])(this,tzID,(ulong)type,name);
  UVar1 = UnicodeString::isEmpty(name);
  if (UVar1 != '\0') {
    UnicodeString::UnicodeString
              ((UnicodeString *)local_b8,mzID.fUnion.fStackFields.fBuffer + 0x17,0,0x20);
    (*(this->super_UObject)._vptr_UObject[7])(date,this,tzID,(UnicodeString *)local_b8);
    (*(this->super_UObject)._vptr_UObject[9])(this,local_b8,(ulong)type,name);
    UnicodeString::~UnicodeString((UnicodeString *)local_b8);
  }
  return name;
}

Assistant:

UnicodeString&
TimeZoneNames::getDisplayName(const UnicodeString& tzID, UTimeZoneNameType type, UDate date, UnicodeString& name) const {
    getTimeZoneDisplayName(tzID, type, name);
    if (name.isEmpty()) {
        UChar mzIDBuf[32];
        UnicodeString mzID(mzIDBuf, 0, UPRV_LENGTHOF(mzIDBuf));
        getMetaZoneID(tzID, date, mzID);
        getMetaZoneDisplayName(mzID, type, name);
    }
    return name;
}